

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmMovepEaDx<(moira::Instr)78,(moira::Mode)5,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char *pcVar1;
  byte *pbVar2;
  UInt u;
  StrWriter *pSVar3;
  
  u.raw = dasmRead<(moira::Size)2>(this,addr);
  pSVar3 = StrWriter::operator<<(str);
  pSVar3 = StrWriter::operator<<(pSVar3);
  StrWriter::operator<<(pSVar3,(Align)(this->tab).raw);
  StrWriter::operator<<(str,"(");
  StrWriter::operator<<(str,u);
  StrWriter::operator<<(str,",");
  pcVar1 = str->ptr;
  str->ptr = pcVar1 + 1;
  *pcVar1 = 'A';
  pbVar2 = (byte *)str->ptr;
  str->ptr = (char *)(pbVar2 + 1);
  *pbVar2 = (byte)op & 7 | 0x30;
  StrWriter::operator<<(str,"), ");
  pcVar1 = str->ptr;
  str->ptr = pcVar1 + 1;
  *pcVar1 = 'D';
  pbVar2 = (byte *)str->ptr;
  str->ptr = (char *)(pbVar2 + 1);
  *pbVar2 = (byte)(op >> 9) & 7 | 0x30;
  return;
}

Assistant:

void
Moira::dasmMovepEaDx(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <MODE_DI,S> ( _____________xxx(op), addr );
    auto dst = Dn             ( ____xxx_________(op)       );

    str << Ins<I>{} << Sz<S>{} << tab;
    str << "(" << UInt(src.ext1) << "," << An{src.reg} << "), " << dst;
}